

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skippable_text.hpp
# Opt level: O3

cpair __thiscall
skippable_text<unsigned_int,_unsigned_int>::pair_ending_at
          (skippable_text<unsigned_int,_unsigned_int> *this,uint i)

{
  uint uVar1;
  uint uVar2;
  cpair cVar3;
  
  if (((this->non_blank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start[i >> 6] >> ((ulong)(byte)~(byte)i & 0x3f) & 1) != 0) {
    uVar1 = prev_non_blank_position(this,i);
    if (uVar1 != this->null) {
      uVar1 = at(this,uVar1);
      uVar2 = at(this,i);
      goto LAB_0010c9a8;
    }
  }
  uVar1 = this->BLANK;
  uVar2 = uVar1;
LAB_0010c9a8:
  cVar3.second = uVar2;
  cVar3.first = uVar1;
  return cVar3;
}

Assistant:

cpair pair_ending_at(itype i){

		assert(i<T.size());

		itype i_1 = is_blank(i) ? null : prev_non_blank_position(i);

		return i_1 == null ? blank_pair() : cpair {at(i_1),at(i)};

	}